

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

insert_return_type * __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
        *this,node_type *node,size_t hashval)

{
  slot_type *f;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
  res;
  size_t local_60;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
  local_58;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_40;
  slot_type *local_38;
  size_t *local_30;
  
  if ((node->
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
      ).alloc_.super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>.
      super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_>._M_engaged == false)
  {
    (__return_storage_ptr__->position).ctrl_ = this->ctrl_ + this->capacity_;
    __return_storage_ptr__->inserted = false;
    *(bool *)((long)&(__return_storage_ptr__->node).
                     super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                     .alloc_.
                     super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>
                     .super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_> + 1)
         = false;
  }
  else {
    local_60 = hashval;
    f = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
        ::slot(&node->
                super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
              );
    local_40 = this;
    local_38 = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
               ::slot(&node->
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                     );
    local_30 = &local_60;
    DecomposePair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>::InsertSlotWithHash<false>,std::pair<int_const,int>const&>
              (&local_58,(priv *)&local_40,(InsertSlotWithHash<false> *)&f->value,
               (pair<const_int,_int> *)hashval);
    if (local_58.second == true) {
      node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
      ::reset(&node->
               super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
             );
      (__return_storage_ptr__->position).ctrl_ = local_58.first.ctrl_;
      (__return_storage_ptr__->position).field_1 = local_58.first.field_1;
      __return_storage_ptr__->inserted = true;
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                       .alloc_.
                       super__Optional_base<std::allocator<std::pair<const_int,_int>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::allocator<std::pair<const_int,_int>_>,_true,_false,_false>
                       .super__Optional_payload_base<std::allocator<std::pair<const_int,_int>_>_> +
               1) = false;
    }
    else {
      (__return_storage_ptr__->position).ctrl_ = local_58.first.ctrl_;
      (__return_storage_ptr__->position).field_1 = local_58.first.field_1;
      __return_storage_ptr__->inserted = false;
      node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
      ::node_handle_base(&(__return_storage_ptr__->node).
                          super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                         ,&node->
                           super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                        );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node, size_t hashval) {
        if (!node) return {end(), false, node_type()};
        const auto& elem = PolicyTraits::element(CommonAccess::GetSlot(node));
        auto res = PolicyTraits::apply(
            InsertSlotWithHash<false>{*this, std::move(*CommonAccess::GetSlot(node)), hashval},
            elem);
        if (res.second) {
            CommonAccess::Reset(&node);
            return {res.first, true, node_type()};
        } else {
            return {res.first, false, std::move(node)};
        }
    }